

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  RayK<4> *pRVar2;
  RayK<4> *pRVar3;
  float fVar4;
  BVH *bvh;
  NodeRef root;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  size_t k;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  int iVar19;
  undefined4 uVar20;
  ulong uVar21;
  ulong uVar22;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  NodeRef *pNVar28;
  bool bVar29;
  vint4 ai_2;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar37;
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi_2;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar62;
  float fVar63;
  vint4 bi_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  undefined1 auVar61 [16];
  vint4 ai_1;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 ai_3;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 bi;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  float fVar89;
  undefined1 auVar90 [16];
  float fVar95;
  undefined1 auVar91 [16];
  float fVar93;
  float fVar94;
  undefined1 auVar92 [64];
  undefined1 auVar96 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uint uVar106;
  uint uVar107;
  float fVar108;
  uint uVar109;
  undefined1 auVar105 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_3738 [8];
  float fStack_3730;
  float fStack_372c;
  undefined1 local_3728 [8];
  float fStack_3720;
  float fStack_371c;
  undefined1 local_3718 [8];
  float fStack_3710;
  float fStack_370c;
  float local_36d8;
  float fStack_36d4;
  float fStack_36d0;
  float fStack_36cc;
  float local_36c8;
  float fStack_36c4;
  float fStack_36c0;
  float fStack_36bc;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar52 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar53 = vpcmpeqd_avx(auVar52,(undefined1  [16])valid_i->field_0);
    auVar39 = ZEXT816(0) << 0x40;
    auVar5 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar39,5);
    auVar57 = auVar53 & auVar5;
    if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar57[0xf] < '\0')
    {
      auVar5 = vandps_avx(auVar5,auVar53);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar96._8_4_ = 0x7fffffff;
      auVar96._0_8_ = 0x7fffffff7fffffff;
      auVar96._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx(auVar96,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar85._8_4_ = 0x219392ef;
      auVar85._0_8_ = 0x219392ef219392ef;
      auVar85._12_4_ = 0x219392ef;
      auVar53 = vcmpps_avx(auVar53,auVar85,1);
      auVar57 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar85,auVar53);
      auVar53 = vandps_avx(auVar96,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53 = vcmpps_avx(auVar53,auVar85,1);
      auVar58 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar85,auVar53);
      auVar53 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar96);
      auVar53 = vcmpps_avx(auVar53,auVar85,1);
      auVar53 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar85,auVar53);
      auVar65 = vrcpps_avx(auVar57);
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = &DAT_3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar57 = vfnmadd213ps_fma(auVar57,auVar65,auVar86);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar57,auVar65,auVar65)
      ;
      auVar57 = vrcpps_avx(auVar58);
      auVar58 = vfnmadd213ps_fma(auVar58,auVar57,auVar86);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar58,auVar57,auVar57)
      ;
      auVar57 = vrcpps_avx(auVar53);
      auVar53 = vfnmadd213ps_fma(auVar53,auVar57,auVar86);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar53,auVar57,auVar57)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar53 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar39,1);
      auVar57._8_4_ = 0x20;
      auVar57._0_8_ = 0x2000000020;
      auVar57._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar53,auVar57);
      auVar53 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar39,5);
      auVar58._8_4_ = 0x40;
      auVar58._0_8_ = 0x4000000040;
      auVar58._12_4_ = 0x40;
      auVar65._8_4_ = 0x60;
      auVar65._0_8_ = 0x6000000060;
      auVar65._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar65,auVar58,auVar53);
      auVar53 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar39,5);
      auVar66._8_4_ = 0x80;
      auVar66._0_8_ = 0x8000000080;
      auVar66._12_4_ = 0x80;
      auVar69._8_4_ = 0xa0;
      auVar69._0_8_ = 0xa0000000a0;
      auVar69._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar69,auVar66,auVar53);
      auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar39);
      auVar57 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar39);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar88 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar53,auVar5);
      auVar53._8_4_ = 0xff800000;
      auVar53._0_8_ = 0xff800000ff800000;
      auVar53._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar53,auVar57,auVar5);
      terminated.field_0._0_4_ = auVar5._0_4_ ^ auVar52._0_4_;
      terminated.field_0._4_4_ = auVar5._4_4_ ^ auVar52._4_4_;
      terminated.field_0._8_4_ = auVar5._8_4_ ^ auVar52._8_4_;
      terminated.field_0._12_4_ = auVar5._12_4_ ^ auVar52._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar27 = 3;
      }
      else {
        uVar27 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar23 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar52 = vpcmpeqd_avx(auVar5,auVar5);
      auVar92 = ZEXT1664(auVar52);
LAB_0062ac0f:
      paVar23 = &((vfloat<4> *)paVar23)[-1].field_0;
      root.ptr = pNVar28[-1].ptr;
      pNVar28 = pNVar28 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0062b4da;
      aVar97 = *paVar23;
      auVar52 = vcmpps_avx((undefined1  [16])aVar97,(undefined1  [16])tray.tfar.field_0,1);
      uVar18 = vmovmskps_avx(auVar52);
      if (uVar18 == 0) {
LAB_0062b4eb:
        iVar19 = 2;
      }
      else {
        uVar26 = (ulong)(uVar18 & 0xff);
        uVar18 = POPCOUNT(uVar18 & 0xff);
        iVar19 = 0;
        if (uVar18 <= uVar27) {
          do {
            k = 0;
            for (uVar21 = uVar26; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            bVar29 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar29) {
              terminated.field_0.i[k] = -1;
            }
            uVar26 = uVar26 - 1 & uVar26;
          } while (uVar26 != 0);
          auVar52 = vpcmpeqd_avx(auVar92._0_16_,auVar92._0_16_);
          auVar92 = ZEXT1664(auVar52);
          auVar52 = auVar52 & ~(undefined1  [16])terminated.field_0;
          iVar19 = 3;
          auVar88 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar52[0xf] < '\0') {
            auVar52._8_4_ = 0xff800000;
            auVar52._0_8_ = 0xff800000ff800000;
            auVar52._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar52,
                               (undefined1  [16])terminated.field_0);
            iVar19 = 2;
          }
        }
        if (uVar27 < uVar18) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0062b4da;
              auVar52 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar97,6);
              if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar52[0xf]) goto LAB_0062b4eb;
              uVar26 = (ulong)((uint)root.ptr & 0xf);
              aVar37 = terminated.field_0;
              if (uVar26 == 8) goto LAB_0062b4a4;
              pRVar1 = ray + 0x50;
              pRVar2 = ray + 0x60;
              pRVar3 = ray + 0x40;
              lVar24 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar21 = 0;
              auVar52 = auVar92._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_0062aedd;
            }
            auVar100 = ZEXT1664(auVar88._0_16_);
            uVar26 = 0;
            uVar21 = 8;
            do {
              uVar22 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar26 * 8);
              if (uVar22 != 8) {
                uVar20 = *(undefined4 *)(root.ptr + 0x40 + uVar26 * 4);
                auVar38._4_4_ = uVar20;
                auVar38._0_4_ = uVar20;
                auVar38._8_4_ = uVar20;
                auVar38._12_4_ = uVar20;
                auVar15._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar15._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar15._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar15._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar57 = vfmsub213ps_fma(auVar38,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar15);
                uVar20 = *(undefined4 *)(root.ptr + 0x80 + uVar26 * 4);
                auVar67._4_4_ = uVar20;
                auVar67._0_4_ = uVar20;
                auVar67._8_4_ = uVar20;
                auVar67._12_4_ = uVar20;
                auVar16._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar16._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar16._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar16._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar39 = vfmsub213ps_fma(auVar67,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar16);
                uVar20 = *(undefined4 *)(root.ptr + 0xc0 + uVar26 * 4);
                auVar72._4_4_ = uVar20;
                auVar72._0_4_ = uVar20;
                auVar72._8_4_ = uVar20;
                auVar72._12_4_ = uVar20;
                auVar17._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar17._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar17._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar17._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar58 = vfmsub213ps_fma(auVar72,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar17);
                uVar20 = *(undefined4 *)(root.ptr + 0x60 + uVar26 * 4);
                auVar82._4_4_ = uVar20;
                auVar82._0_4_ = uVar20;
                auVar82._8_4_ = uVar20;
                auVar82._12_4_ = uVar20;
                auVar65 = vfmsub213ps_fma(auVar82,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar15);
                uVar20 = *(undefined4 *)(root.ptr + 0xa0 + uVar26 * 4);
                auVar59._4_4_ = uVar20;
                auVar59._0_4_ = uVar20;
                auVar59._8_4_ = uVar20;
                auVar59._12_4_ = uVar20;
                auVar66 = vfmsub213ps_fma(auVar59,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar16);
                uVar20 = *(undefined4 *)(root.ptr + 0xe0 + uVar26 * 4);
                auVar46._4_4_ = uVar20;
                auVar46._0_4_ = uVar20;
                auVar46._8_4_ = uVar20;
                auVar46._12_4_ = uVar20;
                auVar69 = vfmsub213ps_fma(auVar46,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar17);
                auVar52 = vpminsd_avx(auVar57,auVar65);
                auVar53 = vpminsd_avx(auVar39,auVar66);
                auVar52 = vpmaxsd_avx(auVar52,auVar53);
                auVar53 = vpminsd_avx(auVar58,auVar69);
                auVar53 = vpmaxsd_avx(auVar52,auVar53);
                auVar52 = vpmaxsd_avx(auVar57,auVar65);
                auVar57 = vpmaxsd_avx(auVar39,auVar66);
                auVar57 = vpminsd_avx(auVar52,auVar57);
                auVar52 = vpmaxsd_avx(auVar58,auVar69);
                auVar57 = vpminsd_avx(auVar57,auVar52);
                auVar52 = vpmaxsd_avx(auVar53,(undefined1  [16])tray.tnear.field_0);
                auVar57 = vpminsd_avx(auVar57,(undefined1  [16])tray.tfar.field_0);
                auVar52 = vcmpps_avx(auVar52,auVar57,2);
                if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar52[0xf] < '\0') {
                  auVar52 = vblendvps_avx(auVar88._0_16_,auVar53,auVar52);
                  if (uVar21 != 8) {
                    pNVar28->ptr = uVar21;
                    pNVar28 = pNVar28 + 1;
                    *paVar23 = auVar100._0_16_;
                    paVar23 = paVar23 + 1;
                  }
                  auVar100 = ZEXT1664(auVar52);
                  uVar21 = uVar22;
                }
              }
              aVar97 = auVar100._0_16_;
            } while ((uVar22 != 8) && (bVar29 = uVar26 < 7, uVar26 = uVar26 + 1, bVar29));
            iVar19 = 0;
            if (uVar21 == 8) {
LAB_0062adea:
              bVar29 = false;
              iVar19 = 4;
            }
            else {
              auVar52 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar97,6);
              uVar20 = vmovmskps_avx(auVar52);
              bVar29 = true;
              if ((uint)POPCOUNT(uVar20) <= uVar27) {
                pNVar28->ptr = uVar21;
                pNVar28 = pNVar28 + 1;
                *paVar23 = aVar97;
                paVar23 = paVar23 + 1;
                goto LAB_0062adea;
              }
            }
            root.ptr = uVar21;
          } while (bVar29);
        }
      }
      goto LAB_0062b4dd;
    }
  }
  return;
  while( true ) {
    uVar21 = uVar21 + 1;
    lVar24 = lVar24 + 0xe0;
    auVar52 = auVar57;
    if (uVar26 - 8 <= uVar21) break;
LAB_0062aedd:
    auVar100 = ZEXT1664(auVar52);
    uVar22 = 0;
    while( true ) {
      auVar53 = auVar100._0_16_;
      uVar25 = (ulong)*(uint *)(lVar24 + uVar22 * 4);
      if (uVar25 == 0xffffffff) break;
      fVar93 = *(float *)(lVar24 + -0xc0 + uVar22 * 4);
      auVar60._4_4_ = fVar93;
      auVar60._0_4_ = fVar93;
      auVar60._8_4_ = fVar93;
      auVar60._12_4_ = fVar93;
      fVar94 = *(float *)(lVar24 + -0xb0 + uVar22 * 4);
      auVar70._4_4_ = fVar94;
      auVar70._0_4_ = fVar94;
      auVar70._8_4_ = fVar94;
      auVar70._12_4_ = fVar94;
      fVar95 = *(float *)(lVar24 + -0xa0 + uVar22 * 4);
      auVar77._4_4_ = fVar95;
      auVar77._0_4_ = fVar95;
      auVar77._8_4_ = fVar95;
      auVar77._12_4_ = fVar95;
      local_3718._4_4_ = *(float *)(lVar24 + -0x90 + uVar22 * 4);
      local_3728._4_4_ = *(float *)(lVar24 + -0x80 + uVar22 * 4);
      local_3738._4_4_ = *(float *)(lVar24 + -0x70 + uVar22 * 4);
      fVar89 = *(float *)(lVar24 + -0x20 + uVar22 * 4);
      fVar4 = *(float *)(lVar24 + -0x10 + uVar22 * 4);
      local_3718._0_4_ = local_3718._4_4_;
      fStack_3710 = (float)local_3718._4_4_;
      fStack_370c = (float)local_3718._4_4_;
      fVar10 = fVar93 - (float)local_3718._4_4_;
      auVar98._4_4_ = fVar10;
      auVar98._0_4_ = fVar10;
      auVar98._8_4_ = fVar10;
      auVar98._12_4_ = fVar10;
      local_3728._0_4_ = local_3728._4_4_;
      fStack_3720 = (float)local_3728._4_4_;
      fStack_371c = (float)local_3728._4_4_;
      fVar108 = fVar94 - (float)local_3728._4_4_;
      local_3738._0_4_ = local_3738._4_4_;
      fStack_3730 = (float)local_3738._4_4_;
      fStack_372c = (float)local_3738._4_4_;
      fVar11 = fVar95 - (float)local_3738._4_4_;
      auVar39._4_4_ = fVar11;
      auVar39._0_4_ = fVar11;
      auVar39._8_4_ = fVar11;
      auVar39._12_4_ = fVar11;
      fVar94 = fVar89 - fVar94;
      auVar73._4_4_ = fVar94;
      auVar73._0_4_ = fVar94;
      auVar73._8_4_ = fVar94;
      auVar73._12_4_ = fVar94;
      fVar95 = fVar4 - fVar95;
      fVar94 = fVar94 * fVar10;
      auVar83._4_4_ = fVar95;
      auVar83._0_4_ = fVar95;
      auVar83._8_4_ = fVar95;
      auVar83._12_4_ = fVar95;
      fVar10 = fVar95 * fVar108;
      auVar90._4_4_ = fVar10;
      auVar90._0_4_ = fVar10;
      auVar90._8_4_ = fVar10;
      auVar90._12_4_ = fVar10;
      auVar85 = vfmsub231ps_fma(auVar90,auVar73,auVar39);
      fVar10 = *(float *)(lVar24 + -0x30 + uVar22 * 4);
      fVar93 = fVar10 - fVar93;
      fVar9 = fVar93 * fVar11;
      auVar54._4_4_ = fVar9;
      auVar54._0_4_ = fVar9;
      auVar54._8_4_ = fVar9;
      auVar54._12_4_ = fVar9;
      auVar86 = vfmsub231ps_fma(auVar54,auVar83,auVar98);
      auVar39 = vsubps_avx(auVar60,*(undefined1 (*) [16])ray);
      auVar58 = vsubps_avx(auVar70,*(undefined1 (*) [16])(ray + 0x10));
      auVar65 = vsubps_avx(auVar77,*(undefined1 (*) [16])(ray + 0x20));
      fVar9 = (float)*(undefined8 *)pRVar2;
      auVar78._0_4_ = auVar39._0_4_ * fVar9;
      fVar6 = (float)((ulong)*(undefined8 *)pRVar2 >> 0x20);
      auVar78._4_4_ = auVar39._4_4_ * fVar6;
      fVar7 = (float)*(undefined8 *)(ray + 0x68);
      auVar78._8_4_ = auVar39._8_4_ * fVar7;
      fVar8 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      auVar78._12_4_ = auVar39._12_4_ * fVar8;
      auVar54 = vfmsub231ps_fma(auVar78,auVar65,*(undefined1 (*) [16])pRVar3);
      fVar56 = (float)*(undefined8 *)pRVar3;
      auVar103._0_4_ = fVar56 * auVar58._0_4_;
      fVar62 = (float)((ulong)*(undefined8 *)pRVar3 >> 0x20);
      auVar103._4_4_ = fVar62 * auVar58._4_4_;
      fVar63 = (float)*(undefined8 *)(ray + 0x48);
      auVar103._8_4_ = fVar63 * auVar58._8_4_;
      fVar64 = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      auVar103._12_4_ = fVar64 * auVar58._12_4_;
      auVar60 = vfmsub231ps_fma(auVar103,auVar39,*(undefined1 (*) [16])pRVar1);
      auVar40._0_4_ = fVar95 * auVar60._0_4_;
      auVar40._4_4_ = fVar95 * auVar60._4_4_;
      auVar40._8_4_ = fVar95 * auVar60._8_4_;
      auVar40._12_4_ = fVar95 * auVar60._12_4_;
      auVar57 = vfmadd231ps_fma(auVar40,auVar54,auVar73);
      auVar74._4_4_ = fVar108;
      auVar74._0_4_ = fVar108;
      auVar74._8_4_ = fVar108;
      auVar74._12_4_ = fVar108;
      auVar30._4_4_ = fVar93;
      auVar30._0_4_ = fVar93;
      auVar30._8_4_ = fVar93;
      auVar30._12_4_ = fVar93;
      auVar101._4_4_ = fVar94;
      auVar101._0_4_ = fVar94;
      auVar101._8_4_ = fVar94;
      auVar101._12_4_ = fVar94;
      auVar40 = vfmsub231ps_fma(auVar101,auVar30,auVar74);
      fVar93 = (float)*(undefined8 *)pRVar1;
      auVar84._0_4_ = fVar93 * auVar65._0_4_;
      fVar94 = (float)((ulong)*(undefined8 *)pRVar1 >> 0x20);
      auVar84._4_4_ = fVar94 * auVar65._4_4_;
      fVar95 = (float)*(undefined8 *)(ray + 0x58);
      auVar84._8_4_ = fVar95 * auVar65._8_4_;
      fVar108 = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar84._12_4_ = fVar108 * auVar65._12_4_;
      auVar70 = vfmsub231ps_fma(auVar84,auVar58,*(undefined1 (*) [16])pRVar2);
      auVar66 = vfmadd231ps_fma(auVar57,auVar70,auVar30);
      auVar75._0_4_ = auVar40._0_4_ * fVar9;
      auVar75._4_4_ = auVar40._4_4_ * fVar6;
      auVar75._8_4_ = auVar40._8_4_ * fVar7;
      auVar75._12_4_ = auVar40._12_4_ * fVar8;
      auVar57 = vfmadd231ps_fma(auVar75,auVar86,*(undefined1 (*) [16])pRVar1);
      auVar69 = vfmadd231ps_fma(auVar57,auVar85,*(undefined1 (*) [16])pRVar3);
      auVar100 = ZEXT1664(auVar53);
      auVar47._8_4_ = 0x80000000;
      auVar47._0_8_ = 0x8000000080000000;
      auVar47._12_4_ = 0x80000000;
      auVar57 = vandps_avx(auVar69,auVar47);
      uVar18 = auVar57._0_4_;
      auVar87._0_4_ = uVar18 ^ auVar66._0_4_;
      uVar106 = auVar57._4_4_;
      auVar87._4_4_ = uVar106 ^ auVar66._4_4_;
      uVar107 = auVar57._8_4_;
      auVar87._8_4_ = uVar107 ^ auVar66._8_4_;
      uVar109 = auVar57._12_4_;
      auVar87._12_4_ = uVar109 ^ auVar66._12_4_;
      auVar57 = vcmpps_avx(auVar87,_DAT_01feba10,5);
      auVar66 = auVar53 & auVar57;
      local_36c8 = (float)*(undefined8 *)(ray + 0x30);
      fStack_36c4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_36c0 = (float)*(undefined8 *)(ray + 0x38);
      fStack_36bc = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_36d8 = (float)*(undefined8 *)(ray + 0x80);
      fStack_36d4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_36d0 = (float)*(undefined8 *)(ray + 0x88);
      fStack_36cc = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      auVar30 = auVar85;
      if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar66[0xf] < '\0'
         ) {
        auVar57 = vandps_avx(auVar57,auVar53);
        auVar32._0_4_ = auVar60._0_4_ * fVar11;
        auVar32._4_4_ = auVar60._4_4_ * fVar11;
        auVar32._8_4_ = auVar60._8_4_ * fVar11;
        auVar32._12_4_ = auVar60._12_4_ * fVar11;
        auVar66 = vfmadd213ps_fma(auVar74,auVar54,auVar32);
        auVar66 = vfmadd213ps_fma(auVar98,auVar70,auVar66);
        auVar49._0_4_ = uVar18 ^ auVar66._0_4_;
        auVar49._4_4_ = uVar106 ^ auVar66._4_4_;
        auVar49._8_4_ = uVar107 ^ auVar66._8_4_;
        auVar49._12_4_ = uVar109 ^ auVar66._12_4_;
        auVar66 = vcmpps_avx(auVar49,_DAT_01feba10,5);
        auVar54 = auVar57 & auVar66;
        auVar30 = auVar65;
        if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar54[0xf] < '\0') {
          auVar54 = vandps_avx(auVar69,auVar96);
          auVar57 = vandps_avx(auVar66,auVar57);
          auVar66 = vsubps_avx(auVar54,auVar87);
          auVar66 = vcmpps_avx(auVar66,auVar49,5);
          auVar60 = auVar57 & auVar66;
          if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar60[0xf] < '\0') {
            auVar57 = vandps_avx(auVar66,auVar57);
            auVar33._0_4_ = auVar40._0_4_ * auVar65._0_4_;
            auVar33._4_4_ = auVar40._4_4_ * auVar65._4_4_;
            auVar33._8_4_ = auVar40._8_4_ * auVar65._8_4_;
            auVar33._12_4_ = auVar40._12_4_ * auVar65._12_4_;
            auVar58 = vfmadd213ps_fma(auVar58,auVar86,auVar33);
            auVar39 = vfmadd213ps_fma(auVar39,auVar85,auVar58);
            auVar34._0_4_ = uVar18 ^ auVar39._0_4_;
            auVar34._4_4_ = uVar106 ^ auVar39._4_4_;
            auVar34._8_4_ = uVar107 ^ auVar39._8_4_;
            auVar34._12_4_ = uVar109 ^ auVar39._12_4_;
            auVar55._0_4_ = auVar54._0_4_ * local_36c8;
            auVar55._4_4_ = auVar54._4_4_ * fStack_36c4;
            auVar55._8_4_ = auVar54._8_4_ * fStack_36c0;
            auVar55._12_4_ = auVar54._12_4_ * fStack_36bc;
            auVar39 = vcmpps_avx(auVar55,auVar34,1);
            auVar42._0_4_ = auVar54._0_4_ * local_36d8;
            auVar42._4_4_ = auVar54._4_4_ * fStack_36d4;
            auVar42._8_4_ = auVar54._8_4_ * fStack_36d0;
            auVar42._12_4_ = auVar54._12_4_ * fStack_36cc;
            auVar58 = vcmpps_avx(auVar34,auVar42,2);
            auVar39 = vandps_avx(auVar58,auVar39);
            auVar58 = auVar57 & auVar39;
            if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar58[0xf] < '\0') {
              auVar57 = vandps_avx(auVar39,auVar57);
              auVar39 = vcmpps_avx(auVar69,_DAT_01feba10,4);
              auVar58 = auVar57 & auVar39;
              if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar58[0xf] < '\0') {
                uVar18 = ((context->scene->geometries).items[uVar25].ptr)->mask;
                auVar35._4_4_ = uVar18;
                auVar35._0_4_ = uVar18;
                auVar35._8_4_ = uVar18;
                auVar35._12_4_ = uVar18;
                auVar57 = vandps_avx(auVar39,auVar57);
                auVar39 = vpand_avx(auVar35,*(undefined1 (*) [16])(ray + 0x90));
                auVar39 = vpcmpeqd_avx(auVar39,_DAT_01feba10);
                auVar58 = auVar57 & ~auVar39;
                if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar58[0xf] < '\0') {
                  auVar57 = vandnps_avx(auVar39,auVar57);
                  auVar53 = vandnps_avx(auVar57,auVar53);
                  auVar100 = ZEXT1664(auVar53);
                  goto LAB_0062b08d;
                }
              }
            }
          }
          auVar100 = ZEXT1664(auVar53);
        }
      }
LAB_0062b08d:
      auVar53 = auVar100._0_16_;
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar100[0xf])
      {
        bVar29 = false;
        auVar57 = vpcmpeqd_avx(auVar30,auVar30);
      }
      else {
        uVar20 = *(undefined4 *)(lVar24 + -0x60 + uVar22 * 4);
        auVar31._4_4_ = uVar20;
        auVar31._0_4_ = uVar20;
        auVar31._8_4_ = uVar20;
        auVar31._12_4_ = uVar20;
        uVar20 = *(undefined4 *)(lVar24 + -0x50 + uVar22 * 4);
        auVar68._4_4_ = uVar20;
        auVar68._0_4_ = uVar20;
        auVar68._8_4_ = uVar20;
        auVar68._12_4_ = uVar20;
        uVar20 = *(undefined4 *)(lVar24 + -0x40 + uVar22 * 4);
        auVar79._4_4_ = uVar20;
        auVar79._0_4_ = uVar20;
        auVar79._8_4_ = uVar20;
        auVar79._12_4_ = uVar20;
        auVar12._4_4_ = fVar10;
        auVar12._0_4_ = fVar10;
        auVar12._8_4_ = fVar10;
        auVar12._12_4_ = fVar10;
        auVar39 = vsubps_avx(auVar31,auVar12);
        auVar14._4_4_ = fVar89;
        auVar14._0_4_ = fVar89;
        auVar14._8_4_ = fVar89;
        auVar14._12_4_ = fVar89;
        auVar58 = vsubps_avx(auVar68,auVar14);
        auVar13._4_4_ = fVar4;
        auVar13._0_4_ = fVar4;
        auVar13._8_4_ = fVar4;
        auVar13._12_4_ = fVar4;
        auVar65 = vsubps_avx(auVar79,auVar13);
        auVar66 = vsubps_avx(_local_3718,auVar31);
        auVar57 = vsubps_avx(_local_3728,auVar68);
        auVar69 = vsubps_avx(_local_3738,auVar79);
        auVar41._0_4_ = auVar58._0_4_ * auVar69._0_4_;
        auVar41._4_4_ = auVar58._4_4_ * auVar69._4_4_;
        auVar41._8_4_ = auVar58._8_4_ * auVar69._8_4_;
        auVar41._12_4_ = auVar58._12_4_ * auVar69._12_4_;
        auVar60 = vfmsub231ps_fma(auVar41,auVar57,auVar65);
        auVar48._0_4_ = auVar65._0_4_ * auVar66._0_4_;
        auVar48._4_4_ = auVar65._4_4_ * auVar66._4_4_;
        auVar48._8_4_ = auVar65._8_4_ * auVar66._8_4_;
        auVar48._12_4_ = auVar65._12_4_ * auVar66._12_4_;
        auVar40 = vfmsub231ps_fma(auVar48,auVar69,auVar39);
        auVar71._0_4_ = auVar57._0_4_ * auVar39._0_4_;
        auVar71._4_4_ = auVar57._4_4_ * auVar39._4_4_;
        auVar71._8_4_ = auVar57._8_4_ * auVar39._8_4_;
        auVar71._12_4_ = auVar57._12_4_ * auVar39._12_4_;
        auVar70 = vfmsub231ps_fma(auVar71,auVar66,auVar58);
        auVar85 = vsubps_avx(auVar31,*(undefined1 (*) [16])ray);
        auVar86 = vsubps_avx(auVar68,*(undefined1 (*) [16])(ray + 0x10));
        auVar91 = vsubps_avx(auVar79,*(undefined1 (*) [16])(ray + 0x20));
        fVar89 = auVar91._0_4_;
        auVar80._0_4_ = fVar89 * fVar93;
        fVar93 = auVar91._4_4_;
        auVar80._4_4_ = fVar93 * fVar94;
        fVar94 = auVar91._8_4_;
        auVar80._8_4_ = fVar94 * fVar95;
        fVar95 = auVar91._12_4_;
        auVar80._12_4_ = fVar95 * fVar108;
        auVar30 = vfmsub231ps_fma(auVar80,auVar86,*(undefined1 (*) [16])pRVar2);
        auVar102._0_4_ = auVar85._0_4_ * fVar9;
        auVar102._4_4_ = auVar85._4_4_ * fVar6;
        auVar102._8_4_ = auVar85._8_4_ * fVar7;
        auVar102._12_4_ = auVar85._12_4_ * fVar8;
        auVar73 = vfmsub231ps_fma(auVar102,auVar91,*(undefined1 (*) [16])pRVar3);
        auVar104._0_4_ = auVar86._0_4_ * fVar56;
        auVar104._4_4_ = auVar86._4_4_ * fVar62;
        auVar104._8_4_ = auVar86._8_4_ * fVar63;
        auVar104._12_4_ = auVar86._12_4_ * fVar64;
        auVar74 = vfmsub231ps_fma(auVar104,auVar85,*(undefined1 (*) [16])pRVar1);
        auVar105._0_4_ = auVar69._0_4_ * auVar74._0_4_;
        auVar105._4_4_ = auVar69._4_4_ * auVar74._4_4_;
        auVar105._8_4_ = auVar69._8_4_ * auVar74._8_4_;
        auVar105._12_4_ = auVar69._12_4_ * auVar74._12_4_;
        auVar69 = vfmadd231ps_fma(auVar105,auVar73,auVar57);
        auVar99._0_4_ = auVar70._0_4_ * fVar9;
        auVar99._4_4_ = auVar70._4_4_ * fVar6;
        auVar99._8_4_ = auVar70._8_4_ * fVar7;
        auVar99._12_4_ = auVar70._12_4_ * fVar8;
        auVar57 = vfmadd231ps_fma(auVar99,auVar40,*(undefined1 (*) [16])pRVar1);
        auVar54 = vfmadd231ps_fma(auVar57,auVar60,*(undefined1 (*) [16])pRVar3);
        auVar57 = vandps_avx(auVar54,auVar47);
        auVar66 = vfmadd231ps_fma(auVar69,auVar30,auVar66);
        uVar18 = auVar57._0_4_;
        auVar76._0_4_ = auVar66._0_4_ ^ uVar18;
        uVar106 = auVar57._4_4_;
        auVar76._4_4_ = auVar66._4_4_ ^ uVar106;
        uVar107 = auVar57._8_4_;
        auVar76._8_4_ = auVar66._8_4_ ^ uVar107;
        uVar109 = auVar57._12_4_;
        auVar76._12_4_ = auVar66._12_4_ ^ uVar109;
        auVar57 = vcmpps_avx(auVar76,_DAT_01feba10,5);
        auVar66 = auVar53 & auVar57;
        if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar66[0xf]
           ) {
LAB_0062b1b4:
          auVar57 = vpcmpeqd_avx(auVar91,auVar91);
        }
        else {
          auVar57 = vandps_avx(auVar57,auVar53);
          auVar91._0_4_ = auVar74._0_4_ * auVar65._0_4_;
          auVar91._4_4_ = auVar74._4_4_ * auVar65._4_4_;
          auVar91._8_4_ = auVar74._8_4_ * auVar65._8_4_;
          auVar91._12_4_ = auVar74._12_4_ * auVar65._12_4_;
          auVar58 = vfmadd213ps_fma(auVar58,auVar73,auVar91);
          auVar39 = vfmadd213ps_fma(auVar39,auVar30,auVar58);
          auVar81._0_4_ = uVar18 ^ auVar39._0_4_;
          auVar81._4_4_ = uVar106 ^ auVar39._4_4_;
          auVar81._8_4_ = uVar107 ^ auVar39._8_4_;
          auVar81._12_4_ = uVar109 ^ auVar39._12_4_;
          auVar39 = vcmpps_avx(auVar81,_DAT_01feba10,5);
          auVar58 = auVar57 & auVar39;
          if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar58[0xf]) goto LAB_0062b1b4;
          auVar58 = vandps_avx(auVar54,auVar96);
          auVar57 = vandps_avx(auVar39,auVar57);
          auVar39 = vsubps_avx(auVar58,auVar76);
          auVar39 = vcmpps_avx(auVar39,auVar81,5);
          auVar65 = auVar57 & auVar39;
          if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar65[0xf] < '\0') {
            auVar57 = vandps_avx(auVar57,auVar39);
            auVar61._0_4_ = auVar70._0_4_ * fVar89;
            auVar61._4_4_ = auVar70._4_4_ * fVar93;
            auVar61._8_4_ = auVar70._8_4_ * fVar94;
            auVar61._12_4_ = auVar70._12_4_ * fVar95;
            auVar39 = vfmadd213ps_fma(auVar86,auVar40,auVar61);
            auVar39 = vfmadd213ps_fma(auVar85,auVar60,auVar39);
            auVar36._0_4_ = uVar18 ^ auVar39._0_4_;
            auVar36._4_4_ = uVar106 ^ auVar39._4_4_;
            auVar36._8_4_ = uVar107 ^ auVar39._8_4_;
            auVar36._12_4_ = uVar109 ^ auVar39._12_4_;
            auVar43._0_4_ = auVar58._0_4_ * local_36c8;
            auVar43._4_4_ = auVar58._4_4_ * fStack_36c4;
            auVar43._8_4_ = auVar58._8_4_ * fStack_36c0;
            auVar43._12_4_ = auVar58._12_4_ * fStack_36bc;
            auVar39 = vcmpps_avx(auVar43,auVar36,1);
            auVar50._0_4_ = auVar58._0_4_ * local_36d8;
            auVar50._4_4_ = auVar58._4_4_ * fStack_36d4;
            auVar50._8_4_ = auVar58._8_4_ * fStack_36d0;
            auVar50._12_4_ = auVar58._12_4_ * fStack_36cc;
            auVar65 = vcmpps_avx(auVar36,auVar50,2);
            auVar39 = vandps_avx(auVar65,auVar39);
            auVar65 = auVar57 & auVar39;
            if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar65[0xf] < '\0') {
              auVar57 = vandps_avx(auVar39,auVar57);
              auVar39 = vcmpps_avx(auVar54,_DAT_01feba10,4);
              auVar65 = auVar57 & auVar39;
              if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar65[0xf] < '\0') {
                uVar18 = ((context->scene->geometries).items[uVar25].ptr)->mask;
                auVar51._4_4_ = uVar18;
                auVar51._0_4_ = uVar18;
                auVar51._8_4_ = uVar18;
                auVar51._12_4_ = uVar18;
                auVar57 = vandps_avx(auVar39,auVar57);
                auVar39 = vpand_avx(auVar51,*(undefined1 (*) [16])(ray + 0x90));
                auVar39 = vpcmpeqd_avx(auVar39,_DAT_01feba10);
                auVar65 = auVar57 & ~auVar39;
                if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar65[0xf] < '\0') {
                  auVar57 = vandnps_avx(auVar39,auVar57);
                  auVar53 = vandnps_avx(auVar57,auVar53);
                }
              }
            }
          }
          auVar57 = vpcmpeqd_avx(auVar58,auVar58);
        }
        auVar100 = ZEXT1664(auVar53);
        bVar29 = (((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 auVar53[0xf] < '\0';
      }
      auVar53 = auVar100._0_16_;
      auVar92 = ZEXT1664(auVar57);
      auVar88 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((!bVar29) || (bVar29 = 2 < uVar22, uVar22 = uVar22 + 1, bVar29)) break;
    }
    auVar57 = vandps_avx(auVar53,auVar52);
    auVar52 = auVar52 & auVar53;
    if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar52[0xf])
    break;
  }
  aVar37._0_4_ = auVar92._0_4_ ^ auVar57._0_4_;
  aVar37._4_4_ = auVar92._4_4_ ^ auVar57._4_4_;
  aVar37._8_4_ = auVar92._8_4_ ^ auVar57._8_4_;
  aVar37._12_4_ = auVar92._12_4_ ^ auVar57._12_4_;
LAB_0062b4a4:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar37);
  auVar52 = auVar92._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar52[0xf]) {
LAB_0062b4da:
    iVar19 = 3;
  }
  else {
    auVar44._8_4_ = 0xff800000;
    auVar44._0_8_ = 0xff800000ff800000;
    auVar44._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar44,
                       (undefined1  [16])terminated.field_0);
    iVar19 = 0;
  }
LAB_0062b4dd:
  if (iVar19 == 3) {
    auVar5 = vandps_avx(auVar5,(undefined1  [16])terminated.field_0);
    auVar45._8_4_ = 0xff800000;
    auVar45._0_8_ = 0xff800000ff800000;
    auVar45._12_4_ = 0xff800000;
    auVar5 = vmaskmovps_avx(auVar5,auVar45);
    *(undefined1 (*) [16])(ray + 0x80) = auVar5;
    return;
  }
  goto LAB_0062ac0f;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }